

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  uint top;
  uint uVar1;
  uint uVar2;
  ulong _elemsize;
  int *piVar3;
  int iVar4;
  int h;
  ulong uVar5;
  int iVar6;
  int iVar7;
  void *__src;
  size_t __n;
  void *pvVar8;
  Mat m;
  void *ptr;
  uint local_16c;
  Mat local_158;
  Mat *local_110;
  long local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  Mat local_f0;
  long local_b0;
  long local_a8;
  ulong local_a0;
  long local_98;
  Allocator *local_90;
  ulong local_88;
  void *local_80;
  ulong local_78;
  Mat local_70;
  
  local_f0.w = bottom_blob->w;
  local_16c = this->woffset;
  iVar4 = this->outw;
  if (iVar4 == -0xea) {
    iVar6 = ~local_16c + local_f0.w;
  }
  else {
    iVar6 = local_f0.w - local_16c;
    if ((iVar4 != -0xe9) && (iVar4 <= iVar6)) {
      iVar6 = iVar4;
    }
  }
  _c = bottom_blob->c;
  local_f0.h = bottom_blob->h;
  top = this->hoffset;
  iVar4 = this->outh;
  if (iVar4 == -0xea) {
    iVar7 = ~top + local_f0.h;
  }
  else if (iVar4 == -0xe9) {
    iVar7 = local_f0.h - top;
  }
  else {
    iVar7 = local_f0.h - top;
    if (iVar4 <= (int)(local_f0.h - top)) {
      iVar7 = iVar4;
    }
  }
  uVar1 = this->outc;
  uVar2 = this->coffset;
  if (uVar1 == 0xffffff16) {
    local_f0.c = ~uVar2 + _c;
  }
  else if (uVar1 == 0xffffff17) {
    local_f0.c = _c - uVar2;
  }
  else {
    local_f0.c = _c - uVar2;
    if ((int)uVar1 <= (int)(_c - uVar2)) {
      local_f0.c = uVar1;
    }
  }
  _elemsize = bottom_blob->elemsize;
  if ((iVar7 == local_f0.h && iVar6 == local_f0.w) && (local_f0.c == _c)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->packing = bottom_blob->packing;
    top_blob->allocator = bottom_blob->allocator;
    iVar4 = bottom_blob->w;
    iVar6 = bottom_blob->h;
    iVar7 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar4;
    top_blob->h = iVar6;
    top_blob->c = iVar7;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  local_108 = CONCAT44(local_108._4_4_,bottom_blob->dims);
  pvVar8 = (void *)((long)(int)uVar2 * _elemsize * bottom_blob->cstep + (long)bottom_blob->data);
  local_f0.packing = bottom_blob->packing;
  local_f0.allocator = bottom_blob->allocator;
  local_f0.refcount = (int *)0x0;
  local_f0.dims = 3;
  local_f0.cstep =
       ((long)(local_f0.h * local_f0.w) * _elemsize + 0xf & 0xfffffffffffffff0) / _elemsize;
  local_f0.data = pvVar8;
  local_f0.elemsize = _elemsize;
  if (iVar7 == local_f0.h && iVar6 == local_f0.w) {
    if ((bottom_blob->data == (void *)0x0) || ((long)local_f0.c * local_f0.cstep == 0)) {
      local_158.elemsize._0_4_ = 0;
      local_158.elemsize._4_4_ = 0;
      local_158.packing = 0;
      local_158.data = (void *)0x0;
      local_158.refcount = (int *)0x0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.c = 0;
      local_158.cstep = 0;
    }
    else {
      local_158.data = (void *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = (undefined4)_elemsize;
      local_158.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
      local_158.allocator = (Allocator *)0x0;
      local_158.w = local_f0.w;
      local_158.dims = 3;
      local_158.c = local_f0.c;
      local_158.h = local_f0.h;
      __n = (long)local_f0.c * local_f0.cstep * _elemsize;
      uVar5 = __n + 3 & 0xfffffffffffffffc;
      local_70.data = (void *)0x0;
      local_158.packing = local_f0.packing;
      local_158.cstep = local_f0.cstep;
      local_110 = top_blob;
      iVar4 = posix_memalign(&local_70.data,0x10,uVar5 + 4);
      local_158.data = (void *)0x0;
      if (iVar4 == 0) {
        local_158.data = local_70.data;
      }
      local_158.refcount = (int *)((long)local_158.data + uVar5);
      *(undefined4 *)((long)local_158.data + uVar5) = 1;
      memcpy(local_158.data,pvVar8,__n);
      top_blob = local_110;
    }
    if (&local_158 != top_blob) {
      if (local_158.refcount != (int *)0x0) {
        LOCK();
        *local_158.refcount = *local_158.refcount + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->data = local_158.data;
      top_blob->refcount = local_158.refcount;
      top_blob->elemsize = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      top_blob->packing = local_158.packing;
      top_blob->allocator = local_158.allocator;
      top_blob->dims = local_158.dims;
      top_blob->w = local_158.w;
      top_blob->h = local_158.h;
      top_blob->c = local_158.c;
      top_blob->cstep = local_158.cstep;
    }
    if (local_158.refcount != (int *)0x0) {
      LOCK();
      *local_158.refcount = *local_158.refcount + -1;
      UNLOCK();
      if (*local_158.refcount == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar4 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0012e7e8;
    local_16c = this->woffset;
    top = this->hoffset;
  }
  if ((int)local_108 == 3) {
    Mat::create(top_blob,iVar6,iVar7,_c,_elemsize,opt->blob_allocator);
    iVar4 = -100;
    if (((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) ||
       (iVar4 = 0, (int)_c < 1)) goto LAB_0012e7e8;
    local_a8 = (long)(int)local_16c;
    local_80 = local_f0.data;
    local_fc = local_f0.packing;
    local_90 = local_f0.allocator;
    local_98 = local_f0.cstep * local_f0.elemsize;
    local_f8 = local_f0.h;
    local_a0 = (ulong)(local_f0.h * local_f0.w);
    local_88 = local_f0.elemsize;
    local_b0 = (long)(int)(local_f0.w * top) * local_f0.elemsize;
    local_f4 = local_f0.w;
    local_108 = (long)local_f0.w;
    uVar5 = 0;
    local_110 = top_blob;
    do {
      local_158.data = (void *)(local_98 * uVar5 + (long)local_80);
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = (undefined4)local_88;
      local_158.elemsize._4_4_ = (undefined4)(local_88 >> 0x20);
      local_158.packing = local_fc;
      local_158.allocator = local_90;
      local_158.w = local_f4;
      local_158.dims = 2;
      local_158.c = 1;
      local_158.h = local_f8;
      local_158.cstep = local_a0;
      uVar1 = local_110->w;
      iVar4 = local_110->h;
      local_70.elemsize = local_110->elemsize;
      pvVar8 = (void *)(local_110->cstep * uVar5 * local_70.elemsize + (long)local_110->data);
      local_70.packing = local_110->packing;
      local_70.allocator = local_110->allocator;
      local_70.refcount = (int *)0x0;
      local_70.dims = 2;
      local_70.c = 1;
      local_70.cstep = (size_t)(int)(iVar4 * uVar1);
      local_78 = uVar5;
      local_70.data = pvVar8;
      local_70.w = uVar1;
      local_70.h = iVar4;
      if (_elemsize == 4) {
        copy_cut_border_image<float>(&local_158,&local_70,top,local_16c);
      }
      else if ((_elemsize == 1) && (0 < iVar4)) {
        __src = (void *)((long)local_158.data + local_a8 + local_b0);
        iVar6 = 0;
        do {
          if ((int)uVar1 < 0xc) {
            if (0 < (int)uVar1) {
              uVar5 = 0;
              do {
                *(undefined1 *)((long)pvVar8 + uVar5) = *(undefined1 *)((long)__src + uVar5);
                uVar5 = uVar5 + 1;
              } while (uVar1 != uVar5);
            }
          }
          else {
            memcpy(pvVar8,__src,(ulong)uVar1);
          }
          pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar1);
          __src = (void *)((long)__src + local_108);
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar4);
      }
      uVar5 = local_78 + 1;
    } while (uVar5 != _c);
  }
  else if ((int)local_108 == 2) {
    Mat::create(top_blob,iVar7,iVar7,_elemsize,opt->blob_allocator);
    iVar4 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0012e7e8;
    if (_elemsize == 4) {
      copy_cut_border_image<float>(&local_f0,top_blob,top,local_16c);
    }
    else if (_elemsize == 1) {
      copy_cut_border_image<signed_char>(&local_f0,top_blob,top,local_16c);
    }
  }
  iVar4 = 0;
LAB_0012e7e8:
  if (local_f0.refcount != (int *)0x0) {
    LOCK();
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (*local_f0.refcount == 0) {
      if (local_f0.allocator == (Allocator *)0x0) {
        if (local_f0.data != (void *)0x0) {
          free(local_f0.data);
        }
      }
      else {
        (*(local_f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _outw;
    int _outh;
    int _outc;

    if (outw == -233)
        _outw = w - woffset;
    else if (outw == -234)
        _outw = w - 1 - woffset;
    else
        _outw = std::min(outw, w - woffset);

    if (outh == -233)
        _outh = h - hoffset;
    else if (outh == -234)
        _outh = h - 1 - hoffset;
    else
        _outh = std::min(outh, h - hoffset);

    if (outc == -233)
        _outc = channels - coffset;
    else if (outc == -234)
        _outc = channels - 1 - coffset;
    else
        _outc = std::min(outc, channels - coffset);

    if (_outw == w && _outh == h && _outc == channels)
    {
        top_blob = bottom_blob;
        return 0;
    }

    const Mat bottom_blob_sliced = bottom_blob.channel_range(coffset, _outc);

    if (_outw == w && _outh == h)
    {
        top_blob = bottom_blob_sliced.clone();
        if (top_blob.empty())
            return -100;
    }

    int top = hoffset;
    int left = woffset;

    if (dims == 2)
    {
        top_blob.create(_outh, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob_sliced, top_blob, top, left);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob_sliced, top_blob, top, left);
    }

    if (dims == 3)
    {
        top_blob.create(_outw, _outh, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, top, left);
            else if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, top, left);
        }
    }

    return 0;
}